

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

int connection_get_channel_max(CONNECTION_HANDLE connection,uint16_t *channel_max)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (connection == (CONNECTION_HANDLE)0x0 || channel_max == (uint16_t *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x612;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_get_channel_max",0x611,1,
                "Bad arguments: connection = %p, channel_max = %p",connection,channel_max);
    }
  }
  else {
    *channel_max = connection->channel_max;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int connection_get_channel_max(CONNECTION_HANDLE connection, uint16_t* channel_max)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_184: [If connection or channel_max is NULL, connection_get_channel_max shall fail and return a non-zero value.] */
    if ((connection == NULL) ||
        (channel_max == NULL))
    {
        LogError("Bad arguments: connection = %p, channel_max = %p",
            connection, channel_max);
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_S_R_S_CONNECTION_01_182: [connection_get_channel_max shall return in the channel_max argument the current channel_max setting.] */
        *channel_max = connection->channel_max;

        /* Codes_S_R_S_CONNECTION_01_183: [On success, connection_get_channel_max shall return 0.] */
        result = 0;
    }

    return result;
}